

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_push_rect_uv
               (nk_draw_list *list,nk_vec2 a,nk_vec2 c,nk_vec2 uva,nk_vec2 uvc,nk_color color)

{
  nk_draw_index nVar1;
  void *pvVar2;
  nk_draw_index *dst;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar3;
  nk_vec2 uv;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  nk_draw_index index;
  nk_draw_index *idx;
  nk_colorf col;
  nk_vec2 d;
  nk_vec2 b;
  nk_vec2 uvd;
  nk_vec2 uvb;
  void *vtx;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar4;
  nk_color in_stack_ffffffffffffff74;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined2 in_stack_ffffffffffffff8c;
  nk_colorf in_stack_ffffffffffffff98;
  float local_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  if (in_RDI != 0) {
    nk_color_fv((float *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                in_stack_ffffffffffffff74);
    local_20 = (float)in_XMM3_Qa;
    fStack_14 = (float)((ulong)in_XMM2_Qa >> 0x20);
    nVar3 = nk_vec2(local_20,fStack_14);
    fVar8 = nVar3.y;
    local_18 = (float)in_XMM2_Qa;
    fStack_1c = (float)((ulong)in_XMM3_Qa >> 0x20);
    nVar3 = nk_vec2(local_18,fStack_1c);
    fVar7 = nVar3.x;
    local_10 = (float)in_XMM1_Qa;
    fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
    nVar3 = nk_vec2(local_10,fStack_4);
    fVar5 = nVar3.x;
    fVar6 = nVar3.y;
    local_8 = (float)in_XMM0_Qa;
    fStack_c = (float)((ulong)in_XMM1_Qa >> 0x20);
    uv = nk_vec2(local_8,fStack_c);
    fVar4 = uv.y;
    nVar1 = (nk_draw_index)*(undefined4 *)(in_RDI + 0xcc);
    pvVar2 = nk_draw_list_alloc_vertices
                       ((nk_draw_list *)CONCAT44(fVar7,fVar6),CONCAT44(fVar5,fVar4));
    dst = nk_draw_list_alloc_elements((nk_draw_list *)CONCAT44(fVar7,fVar6),CONCAT44(fVar5,fVar4));
    if ((pvVar2 != (void *)0x0) && (dst != (nk_draw_index *)0x0)) {
      *dst = nVar1;
      dst[1] = nVar1 + 1;
      dst[2] = nVar1 + 2;
      dst[3] = nVar1;
      dst[4] = nVar1 + 2;
      dst[5] = nVar1 + 3;
      nk_draw_vertex(dst,(nk_convert_config *)
                         CONCAT26(nVar1,CONCAT24(in_stack_ffffffffffffff8c,fVar8)),nVar3,uv,
                     in_stack_ffffffffffffff98);
      nk_draw_vertex(dst,(nk_convert_config *)
                         CONCAT26(nVar1,CONCAT24(in_stack_ffffffffffffff8c,fVar8)),nVar3,uv,
                     in_stack_ffffffffffffff98);
      nk_draw_vertex(dst,(nk_convert_config *)
                         CONCAT26(nVar1,CONCAT24(in_stack_ffffffffffffff8c,fVar8)),nVar3,uv,
                     in_stack_ffffffffffffff98);
      nk_draw_vertex(dst,(nk_convert_config *)
                         CONCAT26(nVar1,CONCAT24(in_stack_ffffffffffffff8c,fVar8)),nVar3,uv,
                     in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_push_rect_uv(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 c, struct nk_vec2 uva, struct nk_vec2 uvc,
struct nk_color color)
{
void *vtx;
struct nk_vec2 uvb;
struct nk_vec2 uvd;
struct nk_vec2 b;
struct nk_vec2 d;

struct nk_colorf col;
nk_draw_index *idx;
nk_draw_index index;
NK_ASSERT(list);
if (!list) return;

nk_color_fv(&col.r, color);
uvb = nk_vec2(uvc.x, uva.y);
uvd = nk_vec2(uva.x, uvc.y);
b = nk_vec2(c.x, a.y);
d = nk_vec2(a.x, c.y);

index = (nk_draw_index)list->vertex_count;
vtx = nk_draw_list_alloc_vertices(list, 4);
idx = nk_draw_list_alloc_elements(list, 6);
if (!vtx || !idx) return;

idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

vtx = nk_draw_vertex(vtx, &list->config, a, uva, col);
vtx = nk_draw_vertex(vtx, &list->config, b, uvb, col);
vtx = nk_draw_vertex(vtx, &list->config, c, uvc, col);
vtx = nk_draw_vertex(vtx, &list->config, d, uvd, col);
}